

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O0

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference pvVar6;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined4 local_b8;
  allocator<char> local_b1;
  string local_b0;
  uint local_8c;
  undefined1 local_88 [4];
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  allocator<char> local_59;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *scope;
  bool system_local;
  uint *puStack_28;
  bool prepend_local;
  uint *argIndex_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmTargetPropCommandBase *this_local;
  
  scope._6_1_ = system;
  scope._7_1_ = prepend;
  puStack_28 = argIndex;
  argIndex_local = (uint *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  local_38 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)*argIndex);
  bVar1 = std::operator!=(local_38,"PUBLIC");
  if (((bVar1) && (bVar1 = std::operator!=(local_38,"PRIVATE"), bVar1)) &&
     (bVar1 = std::operator!=(local_38,"INTERFACE"), bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"called with invalid arguments",&local_59);
    SetError(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    this_local._7_1_ = 0;
    goto LAB_00376031;
  }
  *puStack_28 = *puStack_28 + 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_88);
  local_8c = *puStack_28;
  while (uVar4 = (ulong)local_8c,
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)argIndex_local), uVar4 < sVar5) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)argIndex_local,(ulong)local_8c);
    bVar1 = std::operator==(pvVar6,"PUBLIC");
    if (bVar1) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)argIndex_local,(ulong)local_8c);
    bVar1 = std::operator==(pvVar6,"PRIVATE");
    if (bVar1) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)argIndex_local,(ulong)local_8c);
    bVar1 = std::operator==(pvVar6,"INTERFACE");
    if (bVar1) break;
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)argIndex_local,(ulong)local_8c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88,pvVar6);
    local_8c = local_8c + 1;
    *puStack_28 = *puStack_28 + 1;
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
  if (bVar1) {
LAB_00375fd6:
    iVar3 = (*this->_vptr_cmTargetPropCommandBase[3])
                      (this,local_38,local_88,(ulong)(scope._7_1_ & 1),(ulong)(scope._6_1_ & 1));
    this_local._7_1_ = (byte)iVar3 & 1;
  }
  else {
    TVar2 = cmTarget::GetType(this->Target);
    if (((TVar2 == INTERFACE_LIBRARY) && (bVar1 = std::operator!=(local_38,"INTERFACE"), bVar1)) &&
       (bVar1 = std::operator!=(&this->Property,"SOURCES"), bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"may only set INTERFACE properties on INTERFACE targets",
                 &local_b1);
      SetError(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = cmTarget::IsImported(this->Target);
      if ((bVar1) && (bVar1 = std::operator!=(local_38,"INTERFACE"), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"may only set INTERFACE properties on IMPORTED targets",
                   &local_d9);
        SetError(this,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator(&local_d9);
        this_local._7_1_ = 0;
      }
      else {
        TVar2 = cmTarget::GetType(this->Target);
        if ((TVar2 != UTILITY) || (bVar1 = std::operator!=(local_38,"PRIVATE"), !bVar1))
        goto LAB_00375fd6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"may only set PRIVATE properties on custom targets",
                   &local_101);
        SetError(this,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator(&local_101);
        this_local._7_1_ = 0;
      }
    }
  }
  local_b8 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
LAB_00376031:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetPropCommandBase::ProcessContentArgs(
  std::vector<std::string> const& args, unsigned int& argIndex, bool prepend,
  bool system)
{
  std::string const& scope = args[argIndex];

  if (scope != "PUBLIC" && scope != "PRIVATE" && scope != "INTERFACE") {
    this->SetError("called with invalid arguments");
    return false;
  }

  ++argIndex;

  std::vector<std::string> content;

  for (unsigned int i = argIndex; i < args.size(); ++i, ++argIndex) {
    if (args[i] == "PUBLIC" || args[i] == "PRIVATE" ||
        args[i] == "INTERFACE") {
      break;
    }
    content.push_back(args[i]);
  }
  if (!content.empty()) {
    if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
        scope != "INTERFACE" && this->Property != "SOURCES") {
      this->SetError("may only set INTERFACE properties on INTERFACE targets");
      return false;
    }
    if (this->Target->IsImported() && scope != "INTERFACE") {
      this->SetError("may only set INTERFACE properties on IMPORTED targets");
      return false;
    }
    if (this->Target->GetType() == cmStateEnums::UTILITY &&
        scope != "PRIVATE") {
      this->SetError("may only set PRIVATE properties on custom targets");
      return false;
    }
  }
  return this->PopulateTargetProperties(scope, content, prepend, system);
}